

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::CommissionerImpl::MakeChannelMask
                  (Error *__return_storage_ptr__,ByteArray *aBuf,uint32_t aChannelMask)

{
  initializer_list<ot::commissioner::ChannelMaskEntry> __l;
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  ChannelMaskEntry *local_218;
  ErrorCode local_1d0;
  allocator<ot::commissioner::ChannelMaskEntry> local_1c9;
  ChannelMaskEntry *local_1c8;
  ChannelMaskEntry local_1c0;
  iterator local_1a0;
  pointer local_198;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_190;
  Error local_178;
  anon_class_1_0_00000001 local_14a;
  v10 local_149;
  v10 *local_148;
  size_t local_140;
  string local_138;
  Error local_118;
  undefined1 local_e0 [8];
  ChannelMaskEntry entry;
  uint32_t aChannelMask_local;
  ByteArray *aBuf_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = aChannelMask;
  Error::Error(__return_storage_ptr__);
  ChannelMaskEntry::ChannelMaskEntry((ChannelMaskEntry *)local_e0);
  if ((entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ & 0x7fff800) != 0) {
    local_e0[0] = '\0';
    utils::Encode<unsigned_int>((ByteArray *)&entry,0x7fff800);
  }
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&entry);
  if (bVar1) {
    MakeChannelMask::anon_class_1_0_00000001::operator()(&local_14a);
    local_58 = &local_148;
    local_60 = &local_149;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_140 = bVar2.size_;
    local_148 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_138;
    local_78 = local_148;
    sStack_70 = local_140;
    local_50 = &local_78;
    local_88 = local_148;
    local_80 = local_140;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,local_88,fmt,args);
    Error::Error(&local_118,kInvalidArgs,&local_138);
    Error::operator=(__return_storage_ptr__,&local_118);
    Error::~Error(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    local_1c8 = &local_1c0;
    ChannelMaskEntry::ChannelMaskEntry(local_1c8,(ChannelMaskEntry *)local_e0);
    local_1a0 = &local_1c0;
    local_198 = (pointer)0x1;
    std::allocator<ot::commissioner::ChannelMaskEntry>::allocator(&local_1c9);
    __l._M_len = (size_type)local_198;
    __l._M_array = local_1a0;
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::vector(&local_190,__l,&local_1c9);
    EncodeChannelMask(&local_178,aBuf,&local_190);
    local_1d0 = kNone;
    bVar1 = commissioner::operator==(&local_178,&local_1d0);
    Error::~Error(&local_178);
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_190);
    std::allocator<ot::commissioner::ChannelMaskEntry>::~allocator(&local_1c9);
    local_218 = (ChannelMaskEntry *)&local_1a0;
    do {
      local_218 = local_218 + -1;
      ChannelMaskEntry::~ChannelMaskEntry(local_218);
    } while (local_218 != &local_1c0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      abort();
    }
  }
  entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  ChannelMaskEntry::~ChannelMaskEntry((ChannelMaskEntry *)local_e0);
  if ((entry.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::MakeChannelMask(ByteArray &aBuf, uint32_t aChannelMask)
{
    Error            error;
    ChannelMaskEntry entry;

    if (kRadio915Mhz)
    {
        if (aChannelMask & kRadio915MhzOqpskChannelMask)
        {
            entry.mPage = kRadioChannelPage2;
            utils::Encode(entry.mMasks, kRadio915MhzOqpskChannelMask);
        }
    }
    else
    {
        if (aChannelMask & kRadio2P4GhzOqpskChannelMask)
        {
            entry.mPage = kRadioChannelPage0;
            utils::Encode(entry.mMasks, kRadio2P4GhzOqpskChannelMask);
        }
    }

    VerifyOrExit(!entry.mMasks.empty(), error = ERROR_INVALID_ARGS("no valid Channel Masks provided"));
    SuccessOrDie(EncodeChannelMask(aBuf, {entry}));

exit:
    return error;
}